

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCanon.c
# Opt level: O1

int Map_CanonComputeSlow
              (uint (*uTruths) [2],int nVarsMax,int nVarsReal,uint *uTruth,uchar *puPhases,
              uint *uTruthRes)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  
  uVar8 = 1 << ((byte)nVarsReal & 0x1f);
  *uTruthRes = 0xffffffff;
  if (nVarsMax < 6) {
    iVar3 = 0;
    if (nVarsReal != 0x1f) {
      uVar9 = 1;
      if (1 < (int)uVar8) {
        uVar9 = uVar8;
      }
      uVar8 = 0;
      iVar3 = 0;
      do {
        uVar11 = *uTruth;
        if (0 < nVarsMax) {
          uVar5 = 1;
          uVar10 = 0;
          do {
            if ((uVar5 & uVar8) != 0) {
              uVar11 = (uTruths[uVar10][0] & uVar11) >> ((byte)uVar5 & 0x1f) |
                       (~uTruths[uVar10][0] & uVar11) << ((byte)uVar5 & 0x1f);
            }
            uVar10 = uVar10 + 1;
            uVar5 = uVar5 * 2;
          } while ((uint)nVarsMax != uVar10);
        }
        if (uVar11 < *uTruthRes) {
          *uTruthRes = uVar11;
          *puPhases = (uchar)uVar8;
          iVar3 = 1;
        }
        else if (iVar3 < 4 && *uTruthRes == uVar11) {
          lVar7 = (long)iVar3;
          iVar3 = iVar3 + 1;
          puPhases[lVar7] = (uchar)uVar8;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar9);
    }
    uTruthRes[1] = *uTruthRes;
  }
  else {
    uTruthRes[1] = 0xffffffff;
    iVar3 = 0;
    if (nVarsReal != 0x1f) {
      uVar9 = 1;
      if (1 < (int)uVar8) {
        uVar9 = uVar8;
      }
      uVar8 = 0;
      iVar3 = 0;
      do {
        uVar11 = *uTruth;
        uVar5 = uTruth[1];
        if (uVar8 != 0) {
          uVar6 = 1;
          uVar10 = 0;
          do {
            uVar1 = uVar11;
            uVar2 = uVar5;
            if (((uVar6 & uVar8) != 0) && (uVar1 = uVar5, uVar2 = uVar11, (int)uVar6 < 0x20)) {
              bVar4 = (byte)uVar6;
              uVar1 = (uTruths[uVar10][0] & uVar11) >> (bVar4 & 0x1f) |
                      (~uTruths[uVar10][0] & uVar11) << (bVar4 & 0x1f);
              uVar2 = (uTruths[uVar10][1] & uVar5) >> (bVar4 & 0x1f) |
                      (~uTruths[uVar10][1] & uVar5) << (bVar4 & 0x1f);
            }
            uVar5 = uVar2;
            uVar11 = uVar1;
            uVar10 = uVar10 + 1;
            uVar6 = uVar6 * 2;
          } while ((uint)nVarsMax != uVar10);
        }
        uVar6 = uTruthRes[1];
        if (uVar5 < uVar6) {
LAB_008bbd15:
          *uTruthRes = uVar11;
          uTruthRes[1] = uVar5;
          *puPhases = (uchar)uVar8;
          iVar3 = 1;
        }
        else if (uVar6 == uVar5) {
          if (uVar11 < *uTruthRes) goto LAB_008bbd15;
          if ((uVar6 == uVar5) && (iVar3 < 4 && *uTruthRes == uVar11)) {
            lVar7 = (long)iVar3;
            iVar3 = iVar3 + 1;
            puPhases[lVar7] = (uchar)uVar8;
          }
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar9);
    }
  }
  if (iVar3 < 1) {
    __assert_fail("nPhases > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mapper/mapperCanon.c"
                  ,0x60,
                  "int Map_CanonComputeSlow(unsigned int (*)[2], int, int, unsigned int *, unsigned char *, unsigned int *)"
                 );
  }
  return iVar3;
}

Assistant:

int Map_CanonComputeSlow( unsigned uTruths[][2], int nVarsMax, int nVarsReal, unsigned uTruth[], unsigned char * puPhases, unsigned uTruthRes[] )
{
    unsigned  uTruthPerm[2];
    int nMints, nPhases, m;

    nPhases = 0;
    nMints = (1 << nVarsReal);
    if ( nVarsMax < 6 )
    {
        uTruthRes[0] = MAP_MASK(32);
        for ( m = 0; m < nMints; m++ )
        {
            uTruthPerm[0] = Map_CanonComputePhase( uTruths, nVarsMax, uTruth[0], m );
            if ( uTruthRes[0] > uTruthPerm[0] )
            {
                uTruthRes[0] = uTruthPerm[0];
                nPhases      = 0;
                puPhases[nPhases++] = (unsigned char)m;
            }
            else if ( uTruthRes[0] == uTruthPerm[0] )
            {
                if ( nPhases < 4 ) // the max number of phases in Map_Super_t
                    puPhases[nPhases++] = (unsigned char)m;
            }
        }
        uTruthRes[1] = uTruthRes[0];
    }
    else
    {
        uTruthRes[0] = MAP_MASK(32);
        uTruthRes[1] = MAP_MASK(32);
        for ( m = 0; m < nMints; m++ )
        {
            Map_CanonComputePhase6( uTruths, nVarsMax, uTruth, m, uTruthPerm );
            if ( uTruthRes[1] > uTruthPerm[1] || (uTruthRes[1] == uTruthPerm[1] && uTruthRes[0] > uTruthPerm[0]) )
            {
                uTruthRes[0] = uTruthPerm[0];
                uTruthRes[1] = uTruthPerm[1];
                nPhases      = 0;
                puPhases[nPhases++] = (unsigned char)m;
            }
            else if ( uTruthRes[1] == uTruthPerm[1] && uTruthRes[0] == uTruthPerm[0] )
            {
                if ( nPhases < 4 ) // the max number of phases in Map_Super_t
                    puPhases[nPhases++] = (unsigned char)m;
            }
        }
    }
    assert( nPhases > 0 );
//    printf( "%d ", nPhases );
    return nPhases;
}